

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

Vec_Ptr_t * Aig_ManVecRandSubset(Vec_Ptr_t *vVec,int nVars)

{
  int iVar1;
  ulong uVar2;
  void **ppvVar3;
  uint uVar4;
  Vec_Ptr_t *p;
  void **__dest;
  void *pvVar5;
  ulong uVar6;
  void **ppvVar7;
  uint uVar8;
  
  p = (Vec_Ptr_t *)malloc(0x10);
  uVar8 = vVec->nSize;
  p->nSize = uVar8;
  iVar1 = vVec->nCap;
  p->nCap = iVar1;
  if ((long)iVar1 == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = (void **)malloc((long)iVar1 << 3);
  }
  p->pArray = __dest;
  memcpy(__dest,vVec->pArray,(long)(int)uVar8 << 3);
  do {
    if ((int)uVar8 <= nVars) {
      return p;
    }
    uVar4 = Aig_ManRandom(0);
    pvVar5 = Vec_PtrEntry(p,uVar4 % uVar8);
    uVar2 = (ulong)uVar8;
    ppvVar3 = __dest + uVar8;
    do {
      ppvVar7 = ppvVar3;
      uVar6 = uVar2;
      if ((int)uVar6 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      uVar2 = uVar6 - 1;
      ppvVar3 = ppvVar7 + -1;
    } while (__dest[uVar6 - 1] != pvVar5);
    for (; (int)uVar6 < (int)uVar8; uVar6 = (ulong)((int)uVar6 + 1)) {
      ppvVar7[-1] = *ppvVar7;
      ppvVar7 = ppvVar7 + 1;
    }
    uVar8 = uVar8 - 1;
    p->nSize = uVar8;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManVecRandSubset( Vec_Ptr_t * vVec, int nVars )
{
    Vec_Ptr_t * vRes;
    void * pEntry;
    unsigned Rand; 
    vRes = Vec_PtrDup(vVec);
    while ( Vec_PtrSize(vRes) > nVars )
    {
        Rand   = Aig_ManRandom( 0 );
        pEntry = Vec_PtrEntry( vRes, Rand % Vec_PtrSize(vRes) );
        Vec_PtrRemove( vRes, pEntry );
    }
    return vRes;
}